

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams_from_file.hpp
# Opt level: O2

void __thiscall
iutest::detail::iuCsvFileParamsGenerator<int>::AppendParams
          (iuCsvFileParamsGenerator<int> *this,params_t *params,string *data)

{
  bool bVar1;
  int param;
  int local_14;
  
  bVar1 = StringIsBlank(data);
  if (!bVar1) {
    bVar1 = StringToValue<int>(data,&local_14);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::push_back(params,&local_14);
    }
  }
  return;
}

Assistant:

void AppendParams(params_t& params, const ::std::string& data)
    {
        if( StringIsBlank(data) )
        {
            return;
        }
        T param;
        if( !StringToValue(data, param) )
        {
            return;
        }
        params.push_back(param);
    }